

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O3

void __thiscall QGraphicsItemPrivate::setPosHelper(QGraphicsItemPrivate *this,QPointF *pos)

{
  double dVar1;
  double dVar2;
  qreal qVar3;
  ulong uVar4;
  
  uVar4 = *(ulong *)&this->field_0x160 | 0x10000000;
  *(ulong *)&this->field_0x160 = uVar4;
  if (this->scene != (QGraphicsScene *)0x0) {
    QGraphicsItem::prepareGeometryChange(this->q_ptr);
    uVar4 = *(ulong *)&this->field_0x160;
  }
  dVar1 = (this->pos).xp;
  dVar2 = (this->pos).yp;
  qVar3 = pos->yp;
  (this->pos).xp = pos->xp;
  (this->pos).yp = qVar3;
  *(ulong *)&this->field_0x160 = uVar4 & 0xffdfffffefffffff | 0x20000000000000;
  if ((uVar4 >> 0x38 & 1) != 0) {
    if ((pos->xp != dVar1) || (NAN(pos->xp) || NAN(dVar1))) {
      QMetaObject::activate
                ((QObject *)(this->q_ptr + -1),&QGraphicsObject::staticMetaObject,4,(void **)0x0);
    }
    if ((pos->yp != dVar2) || (NAN(pos->yp) || NAN(dVar2))) {
      QMetaObject::activate
                ((QObject *)(this->q_ptr + -1),&QGraphicsObject::staticMetaObject,5,(void **)0x0);
      return;
    }
  }
  return;
}

Assistant:

void QGraphicsItemPrivate::setPosHelper(const QPointF &pos)
{
    Q_Q(QGraphicsItem);
    inSetPosHelper = 1;
    if (scene)
        q->prepareGeometryChange();
    QPointF oldPos = this->pos;
    this->pos = pos;
    dirtySceneTransform = 1;
    inSetPosHelper = 0;
    if (isObject) {
        if (pos.x() != oldPos.x())
            emit static_cast<QGraphicsObject *>(q_ptr)->xChanged();
        if (pos.y() != oldPos.y())
            emit static_cast<QGraphicsObject *>(q_ptr)->yChanged();
    }
}